

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pixelshuffle.cpp
# Opt level: O2

int __thiscall
ncnn::PixelShuffle::forward(PixelShuffle *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  uint uVar1;
  int _c;
  ulong uVar2;
  int iVar3;
  int iVar4;
  int _c_00;
  undefined4 *puVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  undefined4 *puVar9;
  long lVar10;
  int sw;
  long lVar11;
  long lVar12;
  undefined4 *puVar13;
  Mat m;
  Mat local_78;
  
  iVar6 = bottom_blob->w;
  uVar1 = bottom_blob->h;
  iVar3 = this->upscale_factor;
  _c = bottom_blob->c / (iVar3 * iVar3);
  Mat::create(top_blob,iVar3 * iVar6,iVar3 * uVar1,_c,bottom_blob->elemsize,opt->blob_allocator);
  iVar3 = -100;
  if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
    if (iVar6 < 1) {
      iVar6 = 0;
    }
    uVar7 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar7 = 0;
    }
    iVar3 = 0;
    if (0 < _c) {
      iVar3 = _c;
    }
    for (_c_00 = 0; _c_00 != iVar3; _c_00 = _c_00 + 1) {
      Mat::channel(&m,top_blob,_c_00);
      uVar2 = (ulong)(uint)this->upscale_factor;
      for (lVar12 = 0; lVar12 < (int)uVar2; lVar12 = lVar12 + 1) {
        lVar10 = 0;
        lVar11 = 0;
        while( true ) {
          iVar4 = (int)uVar2;
          if (iVar4 <= lVar11) break;
          if (this->mode == 0) {
            iVar4 = (iVar4 * _c_00 + (int)lVar12) * iVar4 + (int)lVar11;
          }
          else {
            iVar4 = (iVar4 * (int)lVar12 + (int)lVar11) * _c + _c_00;
          }
          Mat::channel(&local_78,bottom_blob,iVar4);
          puVar13 = (undefined4 *)local_78.data;
          Mat::~Mat(&local_78);
          uVar2 = (ulong)this->upscale_factor;
          puVar5 = (undefined4 *)((long)m.w * m.elemsize * lVar12 + lVar10 + (long)m.data);
          for (uVar8 = 0; puVar9 = puVar5, iVar4 = iVar6, uVar8 != uVar7; uVar8 = uVar8 + 1) {
            while (iVar4 != 0) {
              *puVar9 = *puVar13;
              puVar13 = puVar13 + 1;
              puVar9 = puVar9 + uVar2;
              iVar4 = iVar4 + -1;
            }
            puVar5 = (undefined4 *)((long)puVar5 + (long)m.w * m.elemsize * uVar2);
          }
          lVar11 = lVar11 + 1;
          lVar10 = lVar10 + 4;
        }
      }
      Mat::~Mat(&m);
    }
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int PixelShuffle::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

    int outw = w * upscale_factor;
    int outh = h * upscale_factor;
    int outc = channels / (upscale_factor * upscale_factor);

    top_blob.create(outw, outh, outc, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outc; p++)
    {
        Mat m = top_blob.channel(p);

        for (int sh = 0; sh < upscale_factor; sh++)
        {
            for (int sw = 0; sw < upscale_factor; sw++)
            {
                int q;
                if (mode == 0)
                    q = p * upscale_factor * upscale_factor + sh * upscale_factor + sw;
                else // if (mode == 1)
                    q = (sh * upscale_factor + sw) * outc + p;

                const float* sptr = bottom_blob.channel(q);

                for (int i = 0; i < h; i++)
                {
                    float* outptr = m.row(i * upscale_factor + sh) + sw;
                    for (int j = 0; j < w; j++)
                    {
                        outptr[0] = sptr[0];

                        sptr++;
                        outptr += upscale_factor;
                    }
                }
            }
        }
    }

    return 0;
}